

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

void http1_sse_on_close(intptr_t uuid,fio_protocol_s *p_)

{
  http1_sse_fio_protocol_s *p;
  fio_protocol_s *p__local;
  intptr_t uuid_local;
  
  http_sse_destroy((http_sse_internal_s *)p_[1].on_data);
  fio_free(p_);
  return;
}

Assistant:

static void http1_sse_on_close(intptr_t uuid, fio_protocol_s *p_) {
  http1_sse_fio_protocol_s *p = (http1_sse_fio_protocol_s *)p_;
  http_sse_destroy(p->sse);
  fio_free(p);
  (void)uuid;
}